

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::AdamOptimizer::SharedCtor(AdamOptimizer *this)

{
  *(undefined8 *)((long)&this->beta2_ + 4) = 0;
  *(undefined8 *)((long)&this->eps_ + 4) = 0;
  this->beta1_ = (DoubleParameter *)0x0;
  this->beta2_ = (DoubleParameter *)0x0;
  this->learningrate_ = (DoubleParameter *)0x0;
  this->minibatchsize_ = (Int64Parameter *)0x0;
  return;
}

Assistant:

void AdamOptimizer::SharedCtor() {
  ::memset(&learningrate_, 0, reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&learningrate_) + sizeof(eps_));
  _cached_size_ = 0;
}